

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O2

CURLcode parse_login_details(char *login,size_t len,char **userp,char **passwdp,char **optionsp)

{
  char *pcVar1;
  char *pcVar2;
  char *__dest;
  char *__dest_00;
  size_t __n;
  char *pcVar3;
  char *pcVar4;
  char *local_58;
  
  if (passwdp == (char **)0x0) {
    pcVar4 = (char *)0x0;
  }
  else {
    pcVar1 = strchr(login,0x3a);
    pcVar4 = (char *)0x0;
    if (pcVar1 < login + len) {
      pcVar4 = pcVar1;
    }
  }
  if (optionsp == (char **)0x0) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar2 = strchr(login,0x3b);
    pcVar1 = (char *)0x0;
    if (pcVar2 < login + len) {
      pcVar1 = pcVar2;
    }
  }
  if (pcVar4 == (char *)0x0) {
    __n = (long)pcVar1 - (long)login;
    if (pcVar1 == (char *)0x0) {
      __n = len;
    }
    pcVar2 = (char *)0x0;
  }
  else {
    pcVar3 = pcVar4;
    if (pcVar1 < pcVar4) {
      pcVar3 = pcVar1;
    }
    pcVar2 = login + len;
    if (pcVar4 < pcVar1) {
      pcVar2 = pcVar1;
    }
    if (pcVar1 == (char *)0x0) {
      pcVar2 = login + len;
      pcVar3 = pcVar4;
    }
    __n = (long)pcVar3 - (long)login;
    pcVar2 = pcVar2 + ~(ulong)pcVar4;
  }
  if (pcVar1 == (char *)0x0) {
    pcVar3 = (char *)0x0;
  }
  else {
    pcVar3 = login + len;
    if (pcVar1 < pcVar4) {
      pcVar3 = pcVar4;
    }
    if (pcVar4 == (char *)0x0) {
      pcVar3 = login + len;
    }
    pcVar3 = pcVar3 + ~(ulong)pcVar1;
  }
  __dest = (char *)0x0;
  if (((userp == (char **)0x0) || (__n == 0)) ||
     (__dest = (char *)(*Curl_cmalloc)(__n + 1), __dest != (char *)0x0)) {
    __dest_00 = (char *)0x0;
    if (((passwdp == (char **)0x0) || (pcVar2 == (char *)0x0)) ||
       (__dest_00 = (char *)(*Curl_cmalloc)((size_t)(pcVar2 + 1)), __dest_00 != (char *)0x0)) {
      local_58 = (char *)0x0;
      if (((optionsp == (char **)0x0) || (pcVar3 == (char *)0x0)) ||
         (local_58 = (char *)(*Curl_cmalloc)((size_t)(pcVar3 + 1)), local_58 != (char *)0x0)) {
        if (__dest != (char *)0x0) {
          memcpy(__dest,login,__n);
          __dest[__n] = '\0';
          (*Curl_cfree)(*userp);
          *userp = __dest;
        }
        if (__dest_00 != (char *)0x0) {
          memcpy(__dest_00,pcVar4 + 1,(size_t)pcVar2);
          __dest_00[(long)pcVar2] = '\0';
          (*Curl_cfree)(*passwdp);
          *passwdp = __dest_00;
        }
        if (local_58 == (char *)0x0) {
          return CURLE_OK;
        }
        memcpy(local_58,pcVar1 + 1,(size_t)pcVar3);
        local_58[(long)pcVar3] = '\0';
        (*Curl_cfree)(*optionsp);
        *optionsp = local_58;
        return CURLE_OK;
      }
      (*Curl_cfree)(__dest_00);
      (*Curl_cfree)(__dest);
    }
    else {
      (*Curl_cfree)(__dest);
    }
  }
  return CURLE_OUT_OF_MEMORY;
}

Assistant:

static CURLcode parse_login_details(const char *login, const size_t len,
                                    char **userp, char **passwdp,
                                    char **optionsp)
{
  CURLcode result = CURLE_OK;
  char *ubuf = NULL;
  char *pbuf = NULL;
  char *obuf = NULL;
  const char *psep = NULL;
  const char *osep = NULL;
  size_t ulen;
  size_t plen;
  size_t olen;

  /* Attempt to find the password separator */
  if(passwdp) {
    psep = strchr(login, ':');

    /* Within the constraint of the login string */
    if(psep >= login + len)
      psep = NULL;
  }

  /* Attempt to find the options separator */
  if(optionsp) {
    osep = strchr(login, ';');

    /* Within the constraint of the login string */
    if(osep >= login + len)
      osep = NULL;
  }

  /* Calculate the portion lengths */
  ulen = (psep ?
          (size_t)(osep && psep > osep ? osep - login : psep - login) :
          (osep ? (size_t)(osep - login) : len));
  plen = (psep ?
          (osep && osep > psep ? (size_t)(osep - psep) :
                                 (size_t)(login + len - psep)) - 1 : 0);
  olen = (osep ?
          (psep && psep > osep ? (size_t)(psep - osep) :
                                 (size_t)(login + len - osep)) - 1 : 0);

  /* Allocate the user portion buffer */
  if(userp && ulen) {
    ubuf = malloc(ulen + 1);
    if(!ubuf)
      result = CURLE_OUT_OF_MEMORY;
  }

  /* Allocate the password portion buffer */
  if(!result && passwdp && plen) {
    pbuf = malloc(plen + 1);
    if(!pbuf) {
      free(ubuf);
      result = CURLE_OUT_OF_MEMORY;
    }
  }

  /* Allocate the options portion buffer */
  if(!result && optionsp && olen) {
    obuf = malloc(olen + 1);
    if(!obuf) {
      free(pbuf);
      free(ubuf);
      result = CURLE_OUT_OF_MEMORY;
    }
  }

  if(!result) {
    /* Store the user portion if necessary */
    if(ubuf) {
      memcpy(ubuf, login, ulen);
      ubuf[ulen] = '\0';
      Curl_safefree(*userp);
      *userp = ubuf;
    }

    /* Store the password portion if necessary */
    if(pbuf) {
      memcpy(pbuf, psep + 1, plen);
      pbuf[plen] = '\0';
      Curl_safefree(*passwdp);
      *passwdp = pbuf;
    }

    /* Store the options portion if necessary */
    if(obuf) {
      memcpy(obuf, osep + 1, olen);
      obuf[olen] = '\0';
      Curl_safefree(*optionsp);
      *optionsp = obuf;
    }
  }

  return result;
}